

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void __thiscall
fmt::v9::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,emphasis em)

{
  bool bVar1;
  long lVar2;
  ulong local_30;
  size_t i;
  size_t index;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  uint8_t em_codes [8];
  emphasis em_local;
  ansi_color_escape<char> *this_local;
  
  em_codes[0] = em;
  unique0x1000015e = this;
  memset((void *)((long)&index + 7),0,8);
  bVar1 = has_emphasis(em_codes[0],bold);
  if (bVar1) {
    index._7_1_ = 1;
  }
  bVar1 = has_emphasis(em_codes[0],faint);
  if (bVar1) {
    local_18 = 2;
  }
  bVar1 = has_emphasis(em_codes[0],italic);
  if (bVar1) {
    local_17 = 3;
  }
  bVar1 = has_emphasis(em_codes[0],underline);
  if (bVar1) {
    local_16 = 4;
  }
  bVar1 = has_emphasis(em_codes[0],blink);
  if (bVar1) {
    local_15 = 5;
  }
  bVar1 = has_emphasis(em_codes[0],reverse);
  if (bVar1) {
    local_14 = 7;
  }
  bVar1 = has_emphasis(em_codes[0],conceal);
  if (bVar1) {
    local_13 = 8;
  }
  bVar1 = has_emphasis(em_codes[0],strikethrough);
  if (bVar1) {
    local_12 = 9;
  }
  i = 0;
  for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
    if (*(char *)((long)&index + local_30 + 7) != '\0') {
      this->buffer[i] = '\x1b';
      this->buffer[i + 1] = '[';
      lVar2 = i + 3;
      this->buffer[i + 2] = *(char *)((long)&index + local_30 + 7) + '0';
      i = i + 4;
      this->buffer[lVar2] = 'm';
    }
  }
  this->buffer[i] = '\0';
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(emphasis em) noexcept {
    uint8_t em_codes[num_emphases] = {};
    if (has_emphasis(em, emphasis::bold)) em_codes[0] = 1;
    if (has_emphasis(em, emphasis::faint)) em_codes[1] = 2;
    if (has_emphasis(em, emphasis::italic)) em_codes[2] = 3;
    if (has_emphasis(em, emphasis::underline)) em_codes[3] = 4;
    if (has_emphasis(em, emphasis::blink)) em_codes[4] = 5;
    if (has_emphasis(em, emphasis::reverse)) em_codes[5] = 7;
    if (has_emphasis(em, emphasis::conceal)) em_codes[6] = 8;
    if (has_emphasis(em, emphasis::strikethrough)) em_codes[7] = 9;

    size_t index = 0;
    for (size_t i = 0; i < num_emphases; ++i) {
      if (!em_codes[i]) continue;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');
      buffer[index++] = static_cast<Char>('0' + em_codes[i]);
      buffer[index++] = static_cast<Char>('m');
    }
    buffer[index++] = static_cast<Char>(0);
  }